

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

int Jf_TtComputeForCut(Jf_Man_t *p,int iFuncLit0,int iFuncLit1,int *pCut0,int *pCut1,int *pCutOut)

{
  Vec_Mem_t *pVVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  word *pwVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  word *pwVar14;
  uint uVar15;
  word uTruth [4];
  word uTruth1 [4];
  word uTruth0 [4];
  word local_a8 [4];
  ulong local_88;
  Jf_Man_t *local_80;
  word local_78 [4];
  word local_58 [5];
  
  iVar2 = p->pPars->nLutSize;
  iVar4 = iVar2 + -6;
  uVar15 = 1 << ((byte)iVar4 & 0x1f);
  uVar7 = 1;
  if (6 < iVar2) {
    uVar7 = uVar15;
  }
  if (iFuncLit0 < 0) {
LAB_0075adc3:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  pVVar1 = p->vTtMem;
  uVar6 = (uint)iFuncLit0 >> 1;
  if ((int)uVar6 < pVVar1->nEntries) {
    bVar3 = (byte)pVVar1->LogPageSze;
    if (iFuncLit1 < 0) goto LAB_0075adc3;
    uVar11 = (uint)iFuncLit1 >> 1;
    if (uVar11 < (uint)pVVar1->nEntries) {
      iVar5 = (uVar6 & pVVar1->PageMask) * pVVar1->nEntrySize;
      pwVar10 = pVVar1->ppPages[uVar6 >> (bVar3 & 0x1f)];
      iVar13 = (pVVar1->PageMask & uVar11) * pVVar1->nEntrySize;
      pwVar14 = pVVar1->ppPages[uVar11 >> (bVar3 & 0x1f)];
      if ((iFuncLit0 & 1U) == 0) {
        if (0 < (int)uVar7) {
          uVar9 = 0;
          do {
            local_58[uVar9] = pwVar10[(long)iVar5 + uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
      }
      else if (0 < (int)uVar7) {
        uVar9 = 0;
        do {
          local_58[uVar9] = ~pwVar10[(long)iVar5 + uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      local_80 = p;
      if ((iFuncLit1 & 1U) == 0) {
        if (0 < (int)uVar7) {
          uVar9 = 0;
          do {
            local_78[uVar9] = pwVar14[(long)iVar13 + uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
      }
      else if (0 < (int)uVar7) {
        uVar9 = 0;
        do {
          local_78[uVar9] = ~pwVar14[(long)iVar13 + uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      uVar6 = (*pCut0 & 0xfU) - 1;
      uVar9 = (ulong)(uint)*pCutOut & 0xf;
      if ((*pCutOut & 0xfU) != 0 && (*pCut0 & 0xfU) != 0) {
        do {
          uVar8 = uVar9 - 1;
          if (pCutOut[uVar9] <= pCut0[(ulong)uVar6 + 1]) {
            if (pCutOut[uVar9] != pCut0[(ulong)uVar6 + 1]) goto LAB_0075ada4;
            if (uVar6 < uVar8) {
              Abc_TtSwapVars(local_58,iVar2,uVar6,(int)uVar8);
            }
            uVar6 = uVar6 - 1;
          }
        } while ((1 < uVar9) && (uVar9 = uVar8, -1 < (int)uVar6));
      }
      if (uVar6 == 0xffffffff) {
        uVar6 = (*pCut1 & 0xfU) - 1;
        if ((*pCutOut & 0xfU) != 0 && (*pCut1 & 0xfU) != 0) {
          uVar9 = (ulong)(uint)*pCutOut & 0xf;
          do {
            uVar8 = uVar9 - 1;
            if (pCutOut[uVar9] <= pCut1[(ulong)uVar6 + 1]) {
              if (pCutOut[uVar9] != pCut1[(ulong)uVar6 + 1]) {
LAB_0075ada4:
                __assert_fail("pCut[i] == pCut0[k]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                              ,0x73c,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
              }
              if (uVar6 < uVar8) {
                Abc_TtSwapVars(local_78,iVar2,uVar6,(int)uVar8);
              }
              uVar6 = uVar6 - 1;
            }
          } while ((1 < uVar9) && (uVar9 = uVar8, -1 < (int)uVar6));
        }
        if (uVar6 == 0xffffffff) {
          uVar6 = (uint)local_78[0] & (uint)local_58[0] & 1;
          if (uVar6 == 0) {
            if (0 < (int)uVar7) {
              uVar9 = 0;
              do {
                local_a8[uVar9] = local_78[uVar9] & local_58[uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar7 != uVar9);
            }
          }
          else if (0 < (int)uVar7) {
            uVar9 = 0;
            do {
              local_a8[uVar9] = ~(local_78[uVar9] & local_58[uVar9]);
              uVar9 = uVar9 + 1;
            } while (uVar7 != uVar9);
          }
          uVar7 = *pCutOut;
          if (iVar2 < (int)uVar7) {
            __assert_fail("nVars <= nVarsAll",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x75b,"int Abc_TtMinBase(word *, int *, int, int)");
          }
          local_88 = (ulong)uVar6;
          if ((int)uVar7 < 1) {
            iVar5 = 0;
          }
          else {
            uVar6 = uVar15;
            if ((int)uVar15 < 2) {
              uVar6 = 1;
            }
            uVar9 = 0;
            iVar5 = 0;
            do {
              if (iVar2 < 7) {
                if ((s_Truths6Neg[uVar9] &
                    (CONCAT71(local_a8[0]._1_7_,(byte)local_a8[0]) >>
                     ((byte)(1 << ((byte)uVar9 & 0x1f)) & 0x3f) ^
                    CONCAT71(local_a8[0]._1_7_,(byte)local_a8[0]))) != 0) {
LAB_0075ac77:
                  if ((long)iVar5 < (long)uVar9) {
                    pCutOut[(long)iVar5 + 1] = pCutOut[uVar9 + 1];
                    Abc_TtSwapVars(local_a8,iVar2,iVar5,(int)uVar9);
                  }
                  iVar5 = iVar5 + 1;
                }
              }
              else if (uVar9 < 6) {
                if (iVar4 != 0x1f) {
                  uVar8 = 0;
                  do {
                    if (((local_a8[uVar8] >> ((byte)(1 << ((byte)uVar9 & 0x1f)) & 0x3f) ^
                         local_a8[uVar8]) & s_Truths6Neg[uVar9]) != 0) goto LAB_0075ac77;
                    uVar8 = uVar8 + 1;
                  } while (uVar6 != uVar8);
                }
              }
              else if (iVar4 != 0x1f) {
                bVar3 = (byte)(uVar9 - 6);
                uVar11 = 1 << (bVar3 & 0x1f);
                iVar13 = 2 << (bVar3 & 0x1f);
                uVar8 = 1;
                if (1 < (int)uVar11) {
                  uVar8 = (ulong)uVar11;
                }
                pwVar14 = local_a8 + (int)uVar11;
                pwVar10 = local_a8;
                do {
                  if (uVar9 - 6 != 0x1f) {
                    uVar12 = 0;
                    do {
                      if (pwVar10[uVar12] != pwVar14[uVar12]) goto LAB_0075ac77;
                      uVar12 = uVar12 + 1;
                    } while (uVar8 != uVar12);
                  }
                  pwVar10 = pwVar10 + iVar13;
                  pwVar14 = pwVar14 + iVar13;
                } while (pwVar10 < local_a8 + (int)uVar15);
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar7);
          }
          if ((int)uVar7 < iVar5) {
            __assert_fail("k < nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
          }
          *pCutOut = iVar5;
          if (((byte)local_a8[0] & 1) != 0) {
            __assert_fail("(uTruth[0] & 1) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                          ,0x43d,"int Jf_TtComputeForCut(Jf_Man_t *, int, int, int *, int *, int *)"
                         );
          }
          iVar2 = Vec_MemHashInsert(local_80->vTtMem,local_a8);
          if (iVar2 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          return (int)local_88 + iVar2 * 2;
        }
      }
      __assert_fail("k == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x741,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nEntries",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
}

Assistant:

int Jf_TtComputeForCut( Jf_Man_t * p, int iFuncLit0, int iFuncLit1, int * pCut0, int * pCut1, int * pCutOut )
{
    word uTruth[JF_WORD_MAX], uTruth0[JF_WORD_MAX], uTruth1[JF_WORD_MAX];
    int fCompl, truthId;
    int LutSize    = p->pPars->nLutSize;
    int nWords     = Abc_Truth6WordNum(p->pPars->nLutSize);
    word * pTruth0 = Vec_MemReadEntry(p->vTtMem, Abc_Lit2Var(iFuncLit0));
    word * pTruth1 = Vec_MemReadEntry(p->vTtMem, Abc_Lit2Var(iFuncLit1));
    Abc_TtCopy( uTruth0, pTruth0, nWords, Abc_LitIsCompl(iFuncLit0) );
    Abc_TtCopy( uTruth1, pTruth1, nWords, Abc_LitIsCompl(iFuncLit1) );
    Abc_TtExpand( uTruth0, LutSize, pCut0 + 1, Jf_CutSize(pCut0), pCutOut + 1, Jf_CutSize(pCutOut) );
    Abc_TtExpand( uTruth1, LutSize, pCut1 + 1, Jf_CutSize(pCut1), pCutOut + 1, Jf_CutSize(pCutOut) );
    fCompl         = (int)(uTruth0[0] & uTruth1[0] & 1);
    Abc_TtAnd( uTruth, uTruth0, uTruth1, nWords, fCompl );
    pCutOut[0]     = Abc_TtMinBase( uTruth, pCutOut + 1, pCutOut[0], LutSize );
    assert( (uTruth[0] & 1) == 0 );
    truthId        = Vec_MemHashInsert(p->vTtMem, uTruth);
    return Abc_Var2Lit( truthId, fCompl );
}